

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_plain_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  SPIRFunction *this_00;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  TypedID<(spirv_cross::Types)1> TVar5;
  uint32_t uVar6;
  uint32_t value;
  size_t sVar7;
  SPIRType *pSVar8;
  SPIREntryPoint *pSVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  Bitset *pBVar12;
  TypedID<(spirv_cross::Types)1> *pTVar13;
  size_type sVar14;
  mapped_type *pmVar15;
  Vector<std::function<void_()>_> *pVVar16;
  bool local_501;
  uint32_t local_4e4;
  uint32_t local_4e0;
  uint32_t local_4dc;
  uint32_t local_4d8;
  uint32_t local_4d4;
  uint32_t local_4d0;
  uint32_t index;
  uint32_t local_4c8;
  uint32_t local_4c4;
  uint32_t local_4c0;
  uint32_t component;
  BuiltIn local_4b8;
  uint32_t local_4b4;
  BuiltIn local_4b0;
  uint32_t locn_3;
  BuiltIn local_4a8;
  uint32_t local_4a4;
  BuiltIn local_4a0;
  uint32_t locn_2;
  uint32_t local_498;
  TypedID<(spirv_cross::Types)1> local_494;
  TypedID<(spirv_cross::Types)1> local_490;
  uint32_t local_48c;
  TypedID<(spirv_cross::Types)1> local_488;
  uint32_t local_484;
  uint32_t local_480;
  uint32_t local_47c;
  uint32_t comp;
  uint32_t local_474;
  uint32_t locn_1;
  CompilerMSL *local_468;
  string local_460 [32];
  function<void_()> local_440;
  anon_class_352_3_cf647172 local_420;
  function<void_()> local_2c0;
  anon_class_16_2_20cb8ece local_2a0;
  function<void_()> local_290;
  TypedID<(spirv_cross::Types)0> local_26c;
  anon_class_56_5_6125726e local_268;
  function<void_()> local_230;
  anon_class_56_5_6125726e local_210;
  function<void_()> local_1d8;
  uint32_t local_1b8;
  uint32_t local_1b4;
  undefined1 local_1b0 [68];
  uint32_t local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [8];
  string qual_var_name;
  allocator local_111;
  string local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [8];
  string mbr_name;
  TypedID<(spirv_cross::Types)1> local_ac;
  TypedID<(spirv_cross::Types)1> local_a8;
  uint32_t local_a4;
  uint32_t local_a0;
  uint32_t local_9c;
  uint32_t local_98;
  uint32_t locn;
  SPIRFunction *pSStack_90;
  bool pad_fragment_output;
  SPIRFunction *entry_func;
  uint32_t start_component;
  bool padded_input;
  uint32_t uStack_7c;
  bool padded_output;
  uint32_t type_components;
  uint32_t target_components;
  SPIRType *type;
  uint32_t local_68;
  uint32_t type_id;
  uint32_t ib_mbr_idx;
  uint32_t local_5c;
  bool is_sample;
  uint32_t local_54;
  bool is_centroid;
  uint32_t local_4c;
  bool is_noperspective;
  uint32_t local_44;
  BuiltIn BStack_40;
  bool is_flat;
  byte local_39;
  BuiltIn builtin;
  bool is_builtin;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_10;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  _builtin = meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_10 = this;
  local_39 = Compiler::is_builtin_variable((Compiler *)this,var);
  local_44 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  BStack_40 = Compiler::get_decoration((Compiler *)this,(ID)local_44,DecorationBuiltIn);
  local_4c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_noperspective = Compiler::has_decoration((Compiler *)this,(ID)local_4c,DecorationFlat);
  local_54 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_centroid = Compiler::has_decoration((Compiler *)this,(ID)local_54,DecorationNoPerspective);
  local_5c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_sample = Compiler::has_decoration((Compiler *)this,(ID)local_5c,DecorationCentroid);
  type_id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  ib_mbr_idx._3_1_ = Compiler::has_decoration((Compiler *)this,(ID)type_id,DecorationSample);
  sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                    ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                     ((var_local->dependees).stack_storage.aligned_char + 0x10));
  local_68 = (uint32_t)sVar7;
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4));
  type._4_4_ = ensure_correct_builtin_type(this,uVar4,BStack_40);
  TypedID<(spirv_cross::Types)1>::TypedID((TypedID<(spirv_cross::Types)1> *)&type,type._4_4_);
  *(undefined4 *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4) = type._0_4_;
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4));
  type._4_4_ = Compiler::get_pointee_type_id((Compiler *)this,uVar4);
  if ((_builtin->strip_array & 1U) != 0) {
    pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
    bVar2 = Compiler::is_array((Compiler *)this,pSVar8);
    if (bVar2) {
      pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
      type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar8->parent_type);
    }
  }
  _type_components = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
  uStack_7c = 0;
  start_component = _type_components->vecsize;
  entry_func._7_1_ = 0;
  entry_func._6_1_ = 0;
  entry_func._0_4_ = 0;
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pSStack_90 = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar4);
  bVar2 = add_component_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRVariable *)meta_local,
                     _type_components,_builtin);
  if (!bVar2) {
    local_98 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    bVar2 = Compiler::has_decoration((Compiler *)this,(ID)local_98,DecorationLocation);
    local_501 = false;
    if ((bVar2) &&
       (local_501 = false, ((this->msl_options).pad_fragment_output_components & 1U) != 0)) {
      pSVar9 = Compiler::get_entry_point((Compiler *)this);
      local_501 = false;
      if (pSVar9->model == ExecutionModelFragment) {
        local_501 = ib_var_ref_local._4_4_ == StorageClassOutput;
      }
    }
    locn._3_1_ = local_501;
    if (local_501 != false) {
      local_a0 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_9c = Compiler::get_decoration((Compiler *)this,(ID)local_a0,DecorationLocation);
      uStack_7c = get_target_components_for_fragment_location(this,local_9c);
      if (start_component < uStack_7c) {
        type._4_4_ = build_extended_vector_type(this,type._4_4_,uStack_7c,Unknown);
        entry_func._7_1_ = 1;
      }
    }
    bVar2 = false;
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_a4 = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->pull_model_inputs,&local_a4);
      bVar2 = sVar10 != 0;
    }
    if (bVar2) {
      pSVar1 = &var_local->dependees;
      uVar4 = build_msl_interpolant_type(this,type._4_4_,(bool)(is_centroid & 1));
      TypedID<(spirv_cross::Types)1>::TypedID(&local_a8,uVar4);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                 ((pSVar1->stack_storage).aligned_char + 0x10),&local_a8);
    }
    else {
      pSVar1 = &var_local->dependees;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_ac,type._4_4_);
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                 ((pSVar1->stack_storage).aligned_char + 0x10),&local_ac);
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_f0,(uint32_t)this,SUB41(uVar4,0));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_110,"m",&local_111);
    ensure_valid_name((CompilerMSL *)local_d0,(string *)this,(string *)local_f0);
    ::std::__cxx11::string::~string(local_110);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
    ::std::__cxx11::string::~string((string *)local_f0);
    TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)TVar5.id,local_68,(string *)local_d0);
    ::std::operator+(local_168,(char *)ib_type_local);
    ::std::operator+(local_148,local_168);
    ::std::__cxx11::string::~string((string *)local_168);
    bVar2 = false;
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_16c = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->pull_model_inputs,&local_16c);
      bVar2 = sVar10 != 0;
    }
    if (bVar2) {
      if ((is_sample & 1U) == 0) {
        if ((ib_mbr_idx._3_1_ & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)local_148,".interpolate_at_center()");
        }
        else {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((CompilerGLSL *)local_1b0,(uint32_t)this,SUB41(this->builtin_sample_id_id,0));
          join<char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                    ((spirv_cross *)(local_1b0 + 0x20),(char (*) [24])".interpolate_at_sample(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (char (*) [2])0x5eaa1a);
          ::std::__cxx11::string::operator+=((string *)local_148,(string *)(local_1b0 + 0x20));
          ::std::__cxx11::string::~string((string *)(local_1b0 + 0x20));
          ::std::__cxx11::string::~string((string *)local_1b0);
        }
      }
      else {
        ::std::__cxx11::string::operator+=((string *)local_148,".interpolate_at_centroid()");
      }
    }
    this_00 = pSStack_90;
    if (((entry_func._7_1_ & 1) == 0) && ((entry_func._6_1_ & 1) == 0)) {
      if ((_builtin->strip_array & 1U) == 0) {
        pmVar11 = ::std::
                  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                  ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                               (key_type *)&(meta_local->location_meta)._M_h._M_bucket_count);
        ::std::__cxx11::string::operator=
                  ((string *)&(pmVar11->decoration).qualified_alias,(string *)local_148);
      }
    }
    else {
      local_1b4 = (uint32_t)
                  TypedID::operator_cast_to_TypedID
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      SPIRFunction::add_local_variable(this_00,(VariableID)local_1b4);
      local_1b8 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&local_1b8);
      if ((entry_func._7_1_ & 1) == 0) {
        pVVar16 = &pSStack_90->fixup_hooks_in;
        local_268.var = (SPIRVariable *)meta_local;
        local_268.this = this;
        ::std::__cxx11::string::string((string *)&local_268.qual_var_name,(string *)local_148);
        local_268.type_components = start_component;
        local_268.start_component = (uint32_t)entry_func;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__1,void>
                  ((function<void()> *)&local_230,&local_268);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar16,&local_230);
        ::std::function<void_()>::~function(&local_230);
        add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_1::~__1((__1 *)&local_268);
      }
      else {
        pVVar16 = &pSStack_90->fixup_hooks_out;
        local_210.var = (SPIRVariable *)meta_local;
        local_210.this = this;
        ::std::__cxx11::string::string((string *)&local_210.qual_var_name,(string *)local_148);
        local_210.type_components = start_component;
        local_210.start_component = (uint32_t)entry_func;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__0,void>
                  ((function<void()> *)&local_1d8,&local_210);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar16,&local_1d8);
        ::std::function<void_()>::~function(&local_1d8);
        add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_0::~__0((__0 *)&local_210);
      }
    }
    bVar2 = false;
    if (*(int *)&(meta_local->location_meta)._M_h._M_before_begin._M_nxt == 3) {
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_26c,0);
      uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_26c);
      bVar2 = uVar4 != uVar6;
    }
    if (bVar2) {
      if (((entry_func._7_1_ & 1) == 0) && ((entry_func._6_1_ & 1) == 0)) {
        if ((_builtin->strip_array & 1U) == 0) {
          pVVar16 = &pSStack_90->fixup_hooks_in;
          _locn_1 = (SPIRVariable *)meta_local;
          local_468 = this;
          ::std::__cxx11::string::string(local_460,(string *)local_148);
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__4,void>
                    ((function<void()> *)&local_440,(anon_class_48_3_cb446c65 *)&locn_1);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar16,&local_440);
          ::std::function<void_()>::~function(&local_440);
          add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
          ::$_4::~__4((__4 *)&locn_1);
        }
        else {
          pVVar16 = &pSStack_90->fixup_hooks_in;
          local_420.var = (SPIRVariable *)meta_local;
          local_420.this = this;
          SPIRType::SPIRType(&local_420.ib_type,(SPIRType *)var_local);
          ::std::function<void()>::
          function<spirv_cross::CompilerMSL::add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__3,void>
                    ((function<void()> *)&local_2c0,&local_420);
          SmallVector<std::function<void_()>,_0UL>::push_back(pVVar16,&local_2c0);
          ::std::function<void_()>::~function(&local_2c0);
          add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
          ::$_3::~__3((__3 *)&local_420);
        }
      }
      else {
        pVVar16 = &pSStack_90->fixup_hooks_in;
        local_2a0.var = (SPIRVariable *)meta_local;
        local_2a0.this = this;
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_plain_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__2,void>
                  ((function<void()> *)&local_290,&local_2a0);
        SmallVector<std::function<void_()>,_0UL>::push_back(pVVar16,&local_290);
        ::std::function<void_()>::~function(&local_290);
      }
    }
    local_474 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_474);
    bVar2 = Bitset::get(pBVar12,0x1e);
    if (bVar2) {
      local_47c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      comp = Compiler::get_decoration((Compiler *)this,(ID)local_47c,DecorationLocation);
      local_484 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_480 = Compiler::get_decoration((Compiler *)this,(ID)local_484,DecorationComponent);
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4))
        ;
        type._4_4_ = ensure_correct_input_type
                               (this,uVar4,comp,local_480,0,(bool)(_builtin->strip_array & 1));
        TypedID<(spirv_cross::Types)1>::TypedID(&local_488,type._4_4_);
        *(uint32_t *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4) = local_488.id;
        type._4_4_ = Compiler::get_pointee_type_id((Compiler *)this,type._4_4_);
        if ((_builtin->strip_array & 1U) != 0) {
          pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
          bVar2 = Compiler::is_array((Compiler *)this,pSVar8);
          if (bVar2) {
            pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
            type._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar8->parent_type);
          }
        }
        local_48c = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
        sVar10 = ::std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::count(&this->pull_model_inputs,&local_48c);
        if (sVar10 == 0) {
          TypedID<(spirv_cross::Types)1>::TypedID(&local_494,type._4_4_);
          pTVar13 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               ((var_local->dependees).stack_storage.aligned_char + 0x10),
                               (ulong)local_68);
          pTVar13->id = local_494.id;
        }
        else {
          uVar4 = build_msl_interpolant_type(this,type._4_4_,(bool)(is_centroid & 1));
          TypedID<(spirv_cross::Types)1>::TypedID(&local_490,uVar4);
          pTVar13 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               ((var_local->dependees).stack_storage.aligned_char + 0x10),
                               (ulong)local_68);
          pTVar13->id = local_490.id;
        }
      }
      local_498 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_498,local_68,DecorationLocation,comp);
      if (local_480 != 0) {
        locn_2 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)locn_2,local_68,DecorationComponent,local_480);
      }
      uVar4 = comp;
      pSVar8 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type._4_4_);
      mark_location_as_used_by_shader(this,uVar4,pSVar8,ib_var_ref_local._4_4_,false);
    }
    else {
      bVar2 = false;
      if ((local_39 & 1) != 0) {
        bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
        bVar2 = false;
        if ((bVar3) && (bVar2 = false, ib_var_ref_local._4_4_ == StorageClassInput)) {
          local_4a0 = BStack_40;
          sVar14 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                   ::count(&this->inputs_by_builtin,&local_4a0);
          bVar2 = sVar14 != 0;
        }
      }
      if (bVar2) {
        local_4a8 = BStack_40;
        pmVar15 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                  ::operator[](&this->inputs_by_builtin,&local_4a8);
        local_4a4 = pmVar15->location;
        locn_3 = (uint32_t)
                 TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)locn_3,local_68,DecorationLocation,local_4a4);
        mark_location_as_used_by_shader
                  (this,local_4a4,_type_components,ib_var_ref_local._4_4_,false);
      }
      else {
        bVar2 = false;
        if ((((local_39 & 1) != 0) && (bVar2 = false, (this->capture_output_to_buffer & 1U) != 0))
           && (bVar2 = false, ib_var_ref_local._4_4_ == StorageClassOutput)) {
          local_4b0 = BStack_40;
          sVar14 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                   ::count(&this->outputs_by_builtin,&local_4b0);
          bVar2 = sVar14 != 0;
        }
        if (bVar2) {
          local_4b8 = BStack_40;
          pmVar15 = ::std::
                    unordered_map<unsigned_int,_spirv_cross::MSLShaderInterfaceVariable,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInterfaceVariable>_>_>
                    ::operator[](&this->outputs_by_builtin,&local_4b8);
          local_4b4 = pmVar15->location;
          component = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(var_local->super_IVariant).self);
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)component,local_68,DecorationLocation,local_4b4);
          mark_location_as_used_by_shader
                    (this,local_4b4,_type_components,ib_var_ref_local._4_4_,false);
        }
      }
    }
    local_4c0 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_4c0);
    bVar2 = Bitset::get(pBVar12,0x1f);
    if (bVar2) {
      local_4c8 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_4c4 = Compiler::get_decoration((Compiler *)this,(ID)local_4c8,DecorationComponent);
      index = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)index,local_68,DecorationComponent,local_4c4);
    }
    local_4d0 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar12 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_4d0);
    bVar2 = Bitset::get(pBVar12,0x20);
    if (bVar2) {
      local_4d8 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_4d4 = Compiler::get_decoration((Compiler *)this,(ID)local_4d8,DecorationIndex);
      local_4dc = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_4dc,local_68,DecorationIndex,local_4d4);
    }
    if ((local_39 & 1) != 0) {
      local_4e0 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_4e0,local_68,DecorationBuiltIn,BStack_40);
      if ((BStack_40 == BuiltInPosition) && (ib_var_ref_local._4_4_ == StorageClassOutput)) {
        ::std::__cxx11::string::operator=((string *)&this->qual_pos_var_name,(string *)local_148);
      }
    }
    bVar2 = true;
    if (ib_var_ref_local._4_4_ == StorageClassInput) {
      local_4e4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
      sVar10 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::count(&this->pull_model_inputs,&local_4e4);
      bVar2 = sVar10 == 0;
    }
    if (bVar2) {
      if ((is_noperspective & 1U) != 0) {
        TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration((Compiler *)this,(TypeID)TVar5.id,local_68,DecorationFlat,0)
        ;
      }
      if ((is_centroid & 1U) != 0) {
        TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)TVar5.id,local_68,DecorationNoPerspective,0);
      }
      if ((is_sample & 1U) != 0) {
        TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)TVar5.id,local_68,DecorationCentroid,0);
      }
      if ((ib_mbr_idx._3_1_ & 1) != 0) {
        TVar5 = TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)TVar5.id,local_68,DecorationSample,0);
      }
    }
    uVar6 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
    uVar4 = local_68;
    value = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    Compiler::set_extended_member_decoration
              ((Compiler *)this,uVar6,uVar4,SPIRVCrossDecorationInterfaceOrigID,value);
    ::std::__cxx11::string::~string((string *)local_148);
    ::std::__cxx11::string::~string((string *)local_d0);
  }
  return;
}

Assistant:

void CompilerMSL::add_plain_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                        SPIRType &ib_type, SPIRVariable &var, InterfaceBlockMeta &meta)
{
	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	// Add a reference to the variable type to the interface struct.
	uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());
	uint32_t type_id = ensure_correct_builtin_type(var.basetype, builtin);
	var.basetype = type_id;

	type_id = get_pointee_type_id(var.basetype);
	if (meta.strip_array && is_array(get<SPIRType>(type_id)))
		type_id = get<SPIRType>(type_id).parent_type;
	auto &type = get<SPIRType>(type_id);
	uint32_t target_components = 0;
	uint32_t type_components = type.vecsize;

	bool padded_output = false;
	bool padded_input = false;
	uint32_t start_component = 0;

	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);

	if (add_component_variable_to_interface_block(storage, ib_var_ref, var, type, meta))
		return;

	bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
	                           msl_options.pad_fragment_output_components &&
	                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

	if (pad_fragment_output)
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		target_components = get_target_components_for_fragment_location(locn);
		if (type_components < target_components)
		{
			// Make a new type here.
			type_id = build_extended_vector_type(type_id, target_components);
			padded_output = true;
		}
	}

	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
		ib_type.member_types.push_back(build_msl_interpolant_type(type_id, is_noperspective));
	else
		ib_type.member_types.push_back(type_id);

	// Give the member a name
	string mbr_name = ensure_valid_name(to_expression(var.self), "m");
	set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

	// Update the original variable reference to include the structure reference
	string qual_var_name = ib_var_ref + "." + mbr_name;
	// If using pull-model interpolation, need to add a call to the correct interpolation method.
	if (storage == StorageClassInput && pull_model_inputs.count(var.self))
	{
		if (is_centroid)
			qual_var_name += ".interpolate_at_centroid()";
		else if (is_sample)
			qual_var_name += join(".interpolate_at_sample(", to_expression(builtin_sample_id_id), ")");
		else
			qual_var_name += ".interpolate_at_center()";
	}

	if (padded_output || padded_input)
	{
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (padded_output)
		{
			entry_func.fixup_hooks_out.push_back([=, &var]() {
				statement(qual_var_name, vector_swizzle(type_components, start_component), " = ", to_name(var.self),
				          ";");
			});
		}
		else
		{
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), " = ", qual_var_name, vector_swizzle(type_components, start_component),
				          ";");
			});
		}
	}
	else if (!meta.strip_array)
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

	if (var.storage == StorageClassOutput && var.initializer != ID(0))
	{
		if (padded_output || padded_input)
		{
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
		}
		else
		{
			if (meta.strip_array)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					uint32_t index = get_extended_decoration(var.self, SPIRVCrossDecorationInterfaceMemberIndex);
					auto invocation = to_tesc_invocation_id();
					statement(to_expression(stage_out_ptr_var_id), "[",
					          invocation, "].",
					          to_member_name(ib_type, index), " = ", to_expression(var.initializer), "[",
					          invocation, "];");
				});
			}
			else
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					statement(qual_var_name, " = ", to_expression(var.initializer), ";");
				});
			}
		}
	}

	// Copy the variable location from the original variable to the member
	if (get_decoration_bitset(var.self).get(DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		uint32_t comp = get_decoration(var.self, DecorationComponent);
		if (storage == StorageClassInput)
		{
			type_id = ensure_correct_input_type(var.basetype, locn, comp, 0, meta.strip_array);
			var.basetype = type_id;

			type_id = get_pointee_type_id(type_id);
			if (meta.strip_array && is_array(get<SPIRType>(type_id)))
				type_id = get<SPIRType>(type_id).parent_type;
			if (pull_model_inputs.count(var.self))
				ib_type.member_types[ib_mbr_idx] = build_msl_interpolant_type(type_id, is_noperspective);
			else
				ib_type.member_types[ib_mbr_idx] = type_id;
		}
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		if (comp)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, comp);
		mark_location_as_used_by_shader(locn, get<SPIRType>(type_id), storage);
	}
	else if (is_builtin && is_tessellation_shader() && storage == StorageClassInput && inputs_by_builtin.count(builtin))
	{
		uint32_t locn = inputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}
	else if (is_builtin && capture_output_to_buffer && storage == StorageClassOutput && outputs_by_builtin.count(builtin))
	{
		uint32_t locn = outputs_by_builtin[builtin].location;
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
		mark_location_as_used_by_shader(locn, type, storage);
	}

	if (get_decoration_bitset(var.self).get(DecorationComponent))
	{
		uint32_t component = get_decoration(var.self, DecorationComponent);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationComponent, component);
	}

	if (get_decoration_bitset(var.self).get(DecorationIndex))
	{
		uint32_t index = get_decoration(var.self, DecorationIndex);
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
	}

	// Mark the member as builtin if needed
	if (is_builtin)
	{
		set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, builtin);
		if (builtin == BuiltInPosition && storage == StorageClassOutput)
			qual_pos_var_name = qual_var_name;
	}

	// Copy interpolation decorations if needed
	if (storage != StorageClassInput || !pull_model_inputs.count(var.self))
	{
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);
	}

	set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);
}